

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

int __thiscall
Simple::Lib::
ProtoSignal<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int),_Simple::Lib::CollectorDefault<void>_>
::SignalLink::unlink(SignalLink *this,char *__name)

{
  int extraout_EAX;
  SignalLink *this_local;
  
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  ::operator=(&this->function,(nullptr_t)0x0);
  if (this->next != (SignalLink *)0x0) {
    this->next->prev = this->prev;
  }
  if (this->prev != (SignalLink *)0x0) {
    this->prev->next = this->next;
  }
  decref(this);
  return extraout_EAX;
}

Assistant:

void
    unlink ()
    {
      function = nullptr;
      if (next)
        next->prev = prev;
      if (prev)
        prev->next = next;
      decref();
      // leave intact ->next, ->prev for stale iterators
    }